

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O0

int Sfm_MffcDeref_rec(Abc_Obj_t *pObj)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  double dVar2;
  int local_20;
  int local_1c;
  int Area;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj_local;
  
  dVar2 = Mio_GateReadArea((Mio_Gate_t *)(pObj->field_5).pData);
  local_20 = Scl_Flt2Int((float)dVar2);
  local_1c = 0;
  while( true ) {
    iVar1 = Abc_ObjFaninNum(pObj);
    if (iVar1 <= local_1c) {
      return local_20;
    }
    pObj_00 = Abc_ObjFanin(pObj,local_1c);
    if ((pObj_00->vFanouts).nSize < 1) break;
    iVar1 = (pObj_00->vFanouts).nSize + -1;
    (pObj_00->vFanouts).nSize = iVar1;
    if ((iVar1 == 0) && (iVar1 = Abc_ObjIsCi(pObj_00), iVar1 == 0)) {
      iVar1 = Sfm_MffcDeref_rec(pObj_00);
      local_20 = iVar1 + local_20;
    }
    local_1c = local_1c + 1;
  }
  __assert_fail("pFanin->vFanouts.nSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                ,0x2b7,"int Sfm_MffcDeref_rec(Abc_Obj_t *)");
}

Assistant:

int Sfm_MffcDeref_rec( Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanin;
    int i, Area = Scl_Flt2Int(Mio_GateReadArea((Mio_Gate_t *)pObj->pData));
    Abc_ObjForEachFanin( pObj, pFanin, i )
    {
        assert( pFanin->vFanouts.nSize > 0 );
        if ( --pFanin->vFanouts.nSize == 0 && !Abc_ObjIsCi(pFanin) )
            Area += Sfm_MffcDeref_rec( pFanin );
    }
    return Area;
}